

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O2

void __thiscall MyClientConnection::MyClientConnection(MyClientConnection *this,MyClient *client)

{
  tonk::SDKConnection::SDKConnection(&this->super_SDKConnection);
  (this->super_SDKConnection)._vptr_SDKConnection = (_func_int **)&PTR__SDKConnection_0010e9d0;
  this->StatusLogCounter = 0;
  this->Client = client;
  this->NextOutgoingWord = 0;
  this->NextPacketIndex = 0;
  (this->OWDStats).SampleCount = 0;
  (this->OWDStats).SampleIndex = 0;
  this->LastStatsUsec = 0;
  return;
}

Assistant:

MyClientConnection(MyClient* client)
        : Client(client)
    {}